

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h261.c
# Opt level: O2

int h261_block(bitstream *str,int32_t *block,int intra)

{
  vs_vlc_val *pvVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint32_t uVar5;
  int iVar6;
  vs_vlc_val *tab;
  uint uVar7;
  long lVar8;
  long lVar9;
  char *__ptr;
  int *piVar10;
  size_t sStack_50;
  uint32_t tmp;
  uint local_3c;
  uint32_t sign;
  uint32_t eb;
  
  if (intra == 0) {
    iVar2 = 0;
  }
  else {
    tmp = *block;
    if (str->dir == VS_ENCODE) {
      if (tmp - 0xff < 0xffffff02) goto LAB_00102448;
      if (tmp == 0x80) {
        tmp = 0xff;
      }
    }
    iVar2 = vs_u(str,&tmp,8);
    if (iVar2 != 0) {
      return 1;
    }
    if (str->dir == VS_DECODE) {
      if ((tmp & 0xffffff7f) == 0) {
LAB_00102448:
        fwrite("Invalid INTRA DC coeff\n",0x17,1,_stderr);
        return 1;
      }
      uVar5 = 0x80;
      if (tmp != 0xff) {
        uVar5 = tmp;
      }
      *block = uVar5;
    }
    iVar2 = 1;
  }
  do {
    tab = block_vlc;
    if (iVar2 == 0) {
      tab = block_0_vlc;
    }
    if (str->dir == VS_ENCODE) {
      lVar9 = (long)iVar2;
      lVar8 = lVar9 << 0x20;
      iVar6 = 0;
      lVar4 = 0;
      while( true ) {
        local_3c = (uint)lVar4;
        if (0x3f < lVar9 + lVar4) break;
        if (block[lVar9 + lVar4] != 0) goto LAB_00102279;
        lVar8 = lVar8 + 0x100000000;
        lVar4 = lVar4 + 1;
        iVar6 = iVar6 + -0x1000;
      }
      if (lVar9 + lVar4 == 0x40) {
        tmp = 0;
        iVar2 = 0x40;
      }
      else {
LAB_00102279:
        uVar3 = *(uint *)((long)block + (lVar8 >> 0x1e));
        uVar7 = -uVar3;
        if (0 < (int)uVar3) {
          uVar7 = uVar3;
        }
        if (0x7f < uVar7) {
          __ptr = "Coeff too large\n";
          sStack_50 = 0x10;
          goto LAB_00102405;
        }
        tmp = uVar7 - iVar6;
        sign = uVar3 >> 0x1f;
        piVar10 = &tab->blen;
        do {
          pvVar1 = (vs_vlc_val *)(piVar10 + -1);
          if (*piVar10 == 0) break;
          piVar10 = piVar10 + 0x22;
        } while (uVar7 - pvVar1->val != iVar6);
        if (uVar7 - (pvVar1->val == 0) != iVar6) {
          tmp = 0xfffff;
        }
        eb = uVar3 & 0xff;
        iVar2 = iVar2 + local_3c + 1;
      }
    }
    iVar6 = vs_vlc(str,&tmp,tab);
    if (iVar6 != 0) {
      return 1;
    }
    lVar4 = (long)iVar2;
    if (tmp == 0xfffff) {
      iVar6 = vs_u(str,&local_3c,6);
      if (iVar6 != 0) {
        return 1;
      }
      iVar6 = vs_u(str,&eb,8);
      if (iVar6 != 0) {
        return 1;
      }
      if ((eb & 0xffffff7f) == 0) {
        __ptr = "Invalid escape code\n";
        sStack_50 = 0x14;
LAB_00102405:
        fwrite(__ptr,sStack_50,1,_stderr);
        return 1;
      }
      uVar3 = eb | 0xffffff00;
      if ((int)eb < 0x81) {
        uVar3 = eb;
      }
    }
    else {
      if (tmp == 0) {
        if (str->dir != VS_DECODE) {
          return 0;
        }
        if (iVar2 < 0x40) {
          memset(block + lVar4,0,(ulong)(0x3f - iVar2) * 4 + 4);
          return 0;
        }
        return 0;
      }
      iVar6 = vs_u(str,&sign,1);
      if (iVar6 != 0) {
        return 1;
      }
      local_3c = tmp >> 0xc;
      uVar3 = -(tmp & 0xfff);
      if (sign == 0) {
        uVar3 = tmp & 0xfff;
      }
    }
    if (str->dir == VS_DECODE) {
      if (0x3f < iVar2) {
LAB_001023f2:
        __ptr = "block overflow\n";
        sStack_50 = 0xf;
        goto LAB_00102405;
      }
      lVar8 = lVar4 << 0x20;
      for (lVar9 = 0; uVar7 = (uint)lVar9, local_3c != uVar7; lVar9 = lVar9 + 1) {
        if (0x40 - lVar4 == lVar9) {
          local_3c = ~uVar7 + local_3c;
          goto LAB_001023f2;
        }
        block[lVar4 + lVar9] = 0;
        lVar8 = lVar8 + 0x100000000;
      }
      iVar2 = iVar2 + uVar7 + 1;
      *(uint *)((long)block + (lVar8 >> 0x1e)) = uVar3;
    }
  } while( true );
}

Assistant:

int h261_block(struct bitstream *str, int32_t *block, int intra) {
	int i = 0;
	if (intra) {
		uint32_t val = block[0];
		if (str->dir == VS_ENCODE) {
			if (val >= 0xff || val == 0) {
				fprintf(stderr, "Invalid INTRA DC coeff\n");
				return 1;
			}
			if (val == 0x80)
				val = 0xff;
		}
		if (vs_u(str, &val, 8)) return 1;
		if (str->dir == VS_DECODE) {
			if (val == 0 || val == 0x80) {
				fprintf(stderr, "Invalid INTRA DC coeff\n");
				return 1;
			}
			if (val == 0xff)
				val = 0x80;
			block[0] = val;
		}
		i = 1;
	}
	while (1) {
		uint32_t tmp, run, eb, sign;
		int32_t coeff;
		const struct vs_vlc_val *tab;
		if (i == 0)
			tab = block_0_vlc;
		else
			tab = block_vlc;
		if (str->dir == VS_ENCODE) {
			run = 0;
			while (i < 64 && !block[i])
				i++, run++;
			if (i == 64) {
				tmp = 0;
			} else {
				coeff = block[i];
				if (abs(coeff) > 127) {
					fprintf(stderr, "Coeff too large\n");
					return 1;
				}
				tmp = abs(coeff) | run << 12;
				sign = coeff < 0;
				int j;
				for (j = 0; tab[j].blen; j++) {
					if (tab[j].val == tmp) {
						break;
					}
				}
				if (!tab[j].val != tmp)
					tmp = 0xfffff;
				eb = coeff & 0xff;
				i++;
			}
		}
		if (vs_vlc(str, &tmp, tab)) return 1;
		if (tmp == 0) {
			/* end of block */
			if (str->dir == VS_DECODE) {
				while (i < 64)
					block[i++] = 0;
			}
			return 0;
		} else if (tmp == 0xfffff) {
			/* escape */
			if (vs_u(str, &run, 6)) return 1;
			if (vs_u(str, &eb, 8)) return 1;
			if (eb == 0 || eb == 0x80) {
				fprintf(stderr, "Invalid escape code\n");
				return 1;
			}
			coeff = eb;
			if (coeff > 0x80)
				coeff |= -0x100;
		} else {
			/* normal coefficient */
			if (vs_u(str, &sign, 1)) return 1;
			run = tmp >> 12;
			if (sign)
				coeff = -(tmp & 0xfff);
			else
				coeff = tmp & 0xfff;
		}
		if (str->dir == VS_DECODE) {
			if (i >= 64) {
				fprintf(stderr, "block overflow\n");
				return 1;
			}
			while (run--) {
				if (i >= 64) {
					fprintf(stderr, "block overflow\n");
					return 1;
				}
				block[i++] = 0;
			}
			block[i++] = coeff;
		}
	}
}